

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

Var Js::JavascriptPromise::EntryCatch(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  RecyclableObject *pRVar2;
  ThreadContext *this;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  RecyclableObject *this_00;
  JavascriptMethod p_Var9;
  int in_stack_00000010;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  RecyclableObject *promise;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  promise = (RecyclableObject *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)promise) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x260,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00cfdc6f;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  __tag.entry.next = (Entry *)promise;
  ArgumentReader::AdjustArguments((ArgumentReader *)&__tag.entry.next,(CallInfo *)&promise);
  if (((ulong)promise & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x261,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00cfdc6f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)promise,
             L"Promise.prototype.catch",&stack0x00000000);
  pvVar7 = Arguments::operator[]((Arguments *)&__tag.entry.next,0);
  BVar5 = JavascriptConversion::ToObject
                    (pvVar7,pSVar1,(RecyclableObject **)&args.super_Arguments.Values);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec41,L"Promise.prototype.catch");
  }
  pvVar7 = JavascriptOperators::GetProperty
                     ((RecyclableObject *)args.super_Arguments.Values,0x169,pSVar1,
                      (PropertyValueInfo *)0x0);
  bVar4 = JavascriptConversion::IsCallable(pvVar7);
  if (bVar4) {
    pRVar2 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
    pRVar8 = pRVar2;
    if (((ulong)__tag.entry.next & 0xfffffe) != 0) {
      pRVar8 = (RecyclableObject *)Arguments::operator[]((Arguments *)&__tag.entry.next,1);
    }
    this_00 = VarTo<Js::RecyclableObject>(pvVar7);
    this = pSVar1->threadContext;
    callInfo_local._7_1_ = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
    if (pSVar1->threadContext->noJsReentrancy != true) {
      p_Var9 = RecyclableObject::GetEntryPoint(this_00);
      CheckIsExecutable(this_00,p_Var9);
      p_Var9 = RecyclableObject::GetEntryPoint(this_00);
      pvVar7 = (*p_Var9)(this_00,(CallInfo)this_00,0x2000003,0,0,0,0,0x2000003,
                         args.super_Arguments.Values,pRVar2,pRVar8);
      this->reentrancySafeOrHandled = (bool)callInfo_local._7_1_;
      AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80);
      return pvVar7;
    }
    Throw::FatalJsReentrancyError();
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec34,L"Promise.prototype.catch");
}

Assistant:

Var JavascriptPromise::EntryCatch(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.prototype.catch"));

        RecyclableObject* promise;

        if (!JavascriptConversion::ToObject(args[0], scriptContext, &promise))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Promise.prototype.catch"));
        }

        Var funcVar = JavascriptOperators::GetProperty(promise, Js::PropertyIds::then, scriptContext);

        if (!JavascriptConversion::IsCallable(funcVar))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Promise.prototype.catch"));
        }

        Var onRejected;
        RecyclableObject* undefinedVar = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count > 1)
        {
            onRejected = args[1];
        }
        else
        {
            onRejected = undefinedVar;
        }

        RecyclableObject* func = VarTo<RecyclableObject>(funcVar);

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(),
                    func, Js::CallInfo(CallFlags_Value, 3),
                    promise,
                    undefinedVar,
                    onRejected);
        }
        END_SAFE_REENTRANT_CALL
    }